

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTriangleMeshShape.cpp
# Opt level: O2

void __thiscall
chrono::ChTriangleMeshShape::SetMesh
          (ChTriangleMeshShape *this,shared_ptr<chrono::geometry::ChTriangleMeshConnected> *mesh,
          bool load_materials)

{
  vector<std::shared_ptr<chrono::ChVisualMaterial>,_std::allocator<std::shared_ptr<chrono::ChVisualMaterial>_>_>
  *this_00;
  string *string;
  float fVar1;
  pointer piVar2;
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  pointer pmVar5;
  pointer pmVar6;
  _Alloc_hider _Var7;
  bool bVar8;
  ostream *poVar9;
  ulong uVar10;
  char cVar11;
  pointer psVar12;
  ulong uVar13;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> *this_01;
  element_type *peVar14;
  int j;
  ulong uVar15;
  long lVar16;
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> materials;
  string err;
  string warn;
  string mtl_base;
  vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> shapes;
  attrib_t att;
  
  this_01 = &this->trimesh;
  std::__shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>::
  operator=(&this_01->
             super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
            ,&mesh->
              super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
           );
  peVar14 = (mesh->
            super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
            )._M_ptr;
  string = &peVar14->m_filename;
  filesystem::path::path((path *)&warn,string);
  filesystem::path::parent_path((path *)&att,(path *)&warn);
  filesystem::path::str_abi_cxx11_(&mtl_base,(path *)&att,native_path);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&warn._M_string_length);
  shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((load_materials) && ((peVar14->m_filename)._M_string_length != 0)) {
    warn._M_dataplus._M_p = (pointer)&warn.field_2;
    att._0_64_ = ZEXT464(0) << 0x40;
    warn._M_string_length = 0;
    warn.field_2._M_local_buf[0] = '\0';
    err._M_dataplus._M_p = (pointer)&err.field_2;
    att.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    att.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    att._64_16_ = att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._0_16_;
    att.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    att.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    att.texcoord_ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data = (_Vector_base<float,_std::allocator<float>_>)0x0;
    att.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    err._M_string_length = 0;
    err.field_2._M_local_buf[0] = '\0';
    bVar8 = tinyobj::LoadObj(&att,&shapes,&materials,&warn,&err,(string->_M_dataplus)._M_p,
                             mtl_base._M_dataplus._M_p,true,true);
    pmVar6 = materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pmVar5 = materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (!bVar8) {
      poVar9 = std::operator<<((ostream *)&std::cerr,"Error loading OBJ file ");
      poVar9 = std::operator<<(poVar9,(string *)string);
      std::endl<char,std::char_traits<char>>(poVar9);
      poVar9 = std::operator<<((ostream *)&std::cerr,"   tiny_obj warning message: ");
      poVar9 = std::operator<<(poVar9,(string *)&warn);
      std::endl<char,std::char_traits<char>>(poVar9);
      poVar9 = std::operator<<((ostream *)&std::cerr,"   tiny_obj error message:   ");
      poVar9 = std::operator<<(poVar9,(string *)&err);
      std::endl<char,std::char_traits<char>>(poVar9);
      poVar9 = std::operator<<((ostream *)&std::cerr,"No materials loaded.");
      std::endl<char,std::char_traits<char>>(poVar9);
    }
    std::__cxx11::string::~string((string *)&err);
    std::__cxx11::string::~string((string *)&warn);
    tinyobj::attrib_t::~attrib_t(&att);
    if (!bVar8) goto LAB_00d67208;
    if (bVar8 && pmVar5 != pmVar6) {
      this_00 = &(this->super_ChVisualShape).material_list;
      std::
      vector<std::shared_ptr<chrono::ChVisualMaterial>,_std::allocator<std::shared_ptr<chrono::ChVisualMaterial>_>_>
      ::clear(this_00);
      lVar16 = 0;
      for (uVar13 = 0;
          uVar13 < (ulong)(((long)materials.
                                  super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)materials.
                                 super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0x748);
          uVar13 = uVar13 + 1) {
        std::make_shared<chrono::ChVisualMaterial>();
        att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ =
             *(undefined4 *)
              ((long)(materials.
                      super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>.
                      _M_impl.super__Vector_impl_data._M_start)->ambient + lVar16 + 8);
        att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start =
             *(pointer *)
              ((long)(materials.
                      super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>.
                      _M_impl.super__Vector_impl_data._M_start)->ambient + lVar16);
        ChVisualMaterial::SetAmbientColor((ChVisualMaterial *)err._M_dataplus._M_p,(ChColor *)&att);
        att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ =
             *(undefined4 *)
              ((long)(materials.
                      super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>.
                      _M_impl.super__Vector_impl_data._M_start)->diffuse + lVar16 + 8);
        att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start =
             *(pointer *)
              ((long)(materials.
                      super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>.
                      _M_impl.super__Vector_impl_data._M_start)->diffuse + lVar16);
        ChVisualMaterial::SetDiffuseColor((ChVisualMaterial *)err._M_dataplus._M_p,(ChColor *)&att);
        att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ =
             *(undefined4 *)
              ((long)(materials.
                      super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>.
                      _M_impl.super__Vector_impl_data._M_start)->specular + lVar16 + 8);
        att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start =
             *(pointer *)
              ((long)(materials.
                      super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>.
                      _M_impl.super__Vector_impl_data._M_start)->specular + lVar16);
        ChVisualMaterial::SetSpecularColor((ChVisualMaterial *)err._M_dataplus._M_p,(ChColor *)&att)
        ;
        att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ =
             *(undefined4 *)
              ((long)(materials.
                      super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>.
                      _M_impl.super__Vector_impl_data._M_start)->emission + lVar16 + 8);
        att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start =
             *(pointer *)
              ((long)(materials.
                      super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>.
                      _M_impl.super__Vector_impl_data._M_start)->emission + lVar16);
        ChVisualMaterial::SetEmissiveColor((ChVisualMaterial *)err._M_dataplus._M_p,(ChColor *)&att)
        ;
        ChVisualMaterial::SetMetallic
                  ((ChVisualMaterial *)err._M_dataplus._M_p,
                   *(float *)((long)(&(materials.
                                       super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->reflection_texopt
                                    + 1) + lVar16 + 4));
        ChVisualMaterial::SetOpacity
                  ((ChVisualMaterial *)err._M_dataplus._M_p,
                   *(float *)((long)(materials.
                                     super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->emission +
                             lVar16 + 0x14));
        ChVisualMaterial::SetIllumination
                  ((ChVisualMaterial *)err._M_dataplus._M_p,
                   *(int *)((long)(materials.
                                   super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->emission +
                           lVar16 + 0x18));
        ChVisualMaterial::SetRoughness
                  ((ChVisualMaterial *)err._M_dataplus._M_p,
                   *(float *)((long)(&(materials.
                                       super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->reflection_texopt
                                    + 1) + lVar16));
        ChVisualMaterial::SetSpecularExponent
                  ((ChVisualMaterial *)err._M_dataplus._M_p,
                   *(float *)((long)(materials.
                                     super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->emission +
                             lVar16 + 0xc));
        fVar1 = *(float *)((long)(&(materials.
                                    super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->reflection_texopt +
                                 1) + lVar16 + 4);
        if ((fVar1 != 0.0) || (NAN(fVar1))) {
LAB_00d66e44:
          cVar11 = '\0';
        }
        else {
          fVar1 = *(float *)((long)(&(materials.
                                      super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->reflection_texopt
                                   + 1) + lVar16);
          cVar11 = '\x01';
          if ((fVar1 != 0.5) || (NAN(fVar1))) goto LAB_00d66e44;
        }
        err._M_dataplus._M_p[0x50] = cVar11;
        bVar8 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)(materials.
                                         super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->emission +
                                 lVar16 + 0x40),"");
        _Var7 = err._M_dataplus;
        if (bVar8) {
          std::operator+(&warn,&mtl_base,"/");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&att,
                         &warn,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)(materials.
                                       super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->emission +
                               lVar16 + 0x40));
          ChVisualMaterial::SetKdTexture((ChVisualMaterial *)_Var7._M_p,(string *)&att,1.0,1.0);
          std::__cxx11::string::~string((string *)&att);
          std::__cxx11::string::~string((string *)&warn);
        }
        bVar8 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)(materials.
                                         super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->emission +
                                 lVar16 + 0x60),"");
        _Var7 = err._M_dataplus;
        if (bVar8) {
          std::operator+(&warn,&mtl_base,"/");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&att,
                         &warn,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)(materials.
                                       super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->emission +
                               lVar16 + 0x60));
          ChVisualMaterial::SetKsTexture((ChVisualMaterial *)_Var7._M_p,(string *)&att,1.0,1.0);
          std::__cxx11::string::~string((string *)&att);
          std::__cxx11::string::~string((string *)&warn);
          err._M_dataplus._M_p[0x50] = '\x01';
        }
        bVar8 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&((materials.
                                           super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->bump_texname)
                                         ._M_dataplus._M_p + lVar16),"");
        _Var7 = err._M_dataplus;
        if (bVar8) {
          std::operator+(&warn,&mtl_base,"/");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&att,
                         &warn,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&((materials.
                                         super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->bump_texname).
                                       _M_dataplus._M_p + lVar16));
          ChVisualMaterial::SetNormalMapTexture
                    ((ChVisualMaterial *)_Var7._M_p,(string *)&att,1.0,1.0);
          std::__cxx11::string::~string((string *)&att);
          std::__cxx11::string::~string((string *)&warn);
        }
        bVar8 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)((materials.
                                          super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->
                                        roughness_texopt).origin_offset + lVar16 + -0x30),"");
        _Var7 = err._M_dataplus;
        if (bVar8) {
          std::operator+(&warn,&mtl_base,"/");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&att,
                         &warn,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)((materials.
                                        super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->roughness_texopt
                                      ).origin_offset + lVar16 + -0x30));
          ChVisualMaterial::SetNormalMapTexture
                    ((ChVisualMaterial *)_Var7._M_p,(string *)&att,1.0,1.0);
          std::__cxx11::string::~string((string *)&att);
          std::__cxx11::string::~string((string *)&warn);
        }
        bVar8 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)(&(materials.
                                           super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                          reflection_texopt + 1) + lVar16 + 0x20),"");
        _Var7 = err._M_dataplus;
        if (bVar8) {
          std::operator+(&warn,&mtl_base,"/");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&att,
                         &warn,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)(&(materials.
                                         super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                        reflection_texopt + 1) + lVar16 + 0x20));
          ChVisualMaterial::SetRoughnessTexture
                    ((ChVisualMaterial *)_Var7._M_p,(string *)&att,1.0,1.0);
          std::__cxx11::string::~string((string *)&att);
          std::__cxx11::string::~string((string *)&warn);
          err._M_dataplus._M_p[0x50] = '\0';
        }
        bVar8 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&((materials.
                                           super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         metallic_texname)._M_dataplus._M_p + lVar16),"");
        _Var7 = err._M_dataplus;
        if (bVar8) {
          std::operator+(&warn,&mtl_base,"/");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&att,
                         &warn,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&((materials.
                                         super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       metallic_texname)._M_dataplus._M_p + lVar16));
          ChVisualMaterial::SetMetallicTexture
                    ((ChVisualMaterial *)_Var7._M_p,(string *)&att,1.0,1.0);
          std::__cxx11::string::~string((string *)&att);
          std::__cxx11::string::~string((string *)&warn);
        }
        bVar8 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)((materials.
                                          super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->ambient_texopt
                                        ).origin_offset + lVar16 + -0x50),"");
        if ((bVar8) &&
           (bVar8 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)((materials.
                                                super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                              ambient_texopt).origin_offset + lVar16 + -0x50),
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)(materials.
                                               super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->emission
                                       + lVar16 + 0x40)), _Var7 = err._M_dataplus, bVar8)) {
          std::operator+(&warn,&mtl_base,"/");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&att,
                         &warn,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)((materials.
                                        super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->ambient_texopt).
                                      origin_offset + lVar16 + -0x50));
          ChVisualMaterial::SetOpacityTexture((ChVisualMaterial *)_Var7._M_p,(string *)&att,1.0,1.0)
          ;
          std::__cxx11::string::~string((string *)&att);
          std::__cxx11::string::~string((string *)&warn);
        }
        std::
        vector<std::shared_ptr<chrono::ChVisualMaterial>,_std::allocator<std::shared_ptr<chrono::ChVisualMaterial>_>_>
        ::push_back(this_00,(value_type *)&err);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&err._M_string_length);
        lVar16 = lVar16 + 0x748;
      }
      peVar14 = (this_01->
                super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr;
      piVar2 = (peVar14->m_face_mat_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((peVar14->m_face_mat_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish != piVar2) {
        (peVar14->m_face_mat_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = piVar2;
      }
      psVar12 = shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                _M_impl.super__Vector_impl_data._M_start;
      for (uVar13 = 0;
          uVar13 < (ulong)(((long)shapes.
                                  super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)psVar12) / 0xe0
                          ); uVar13 = uVar13 + 1) {
        lVar16 = 0;
        for (uVar15 = 0;
            uVar15 < (ulong)(((long)psVar12[uVar13].mesh.indices.
                                    super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)psVar12[uVar13].mesh.indices.
                                   super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0xc) / 3;
            uVar15 = uVar15 + 1) {
          piVar2 = psVar12[uVar13].mesh.material_ids.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar10 = (ulong)*(int *)((long)piVar2 + lVar16);
          if ((long)uVar10 < 0) {
            peVar14 = (this_01->
                      super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr;
LAB_00d67300:
            auVar4._60_4_ = 0;
            auVar4._0_60_ = (undefined1  [60])att._4_60_;
            att._0_64_ = auVar4 << 0x20;
            std::vector<int,_std::allocator<int>_>::emplace_back<int>
                      (&peVar14->m_face_mat_indices,(int *)&att);
          }
          else {
            peVar14 = (this->trimesh).
                      super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
            if ((ulong)((long)(this->super_ChVisualShape).material_list.
                              super__Vector_base<std::shared_ptr<chrono::ChVisualMaterial>,_std::allocator<std::shared_ptr<chrono::ChVisualMaterial>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->super_ChVisualShape).material_list.
                              super__Vector_base<std::shared_ptr<chrono::ChVisualMaterial>,_std::allocator<std::shared_ptr<chrono::ChVisualMaterial>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar10)
            goto LAB_00d67300;
            std::vector<int,_std::allocator<int>_>::push_back
                      (&peVar14->m_face_mat_indices,(value_type_conflict2 *)((long)piVar2 + lVar16))
            ;
          }
          lVar16 = lVar16 + 4;
          psVar12 = shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        }
      }
      goto LAB_00d67208;
    }
  }
  if ((this->super_ChVisualShape).material_list.
      super__Vector_base<std::shared_ptr<chrono::ChVisualMaterial>,_std::allocator<std::shared_ptr<chrono::ChVisualMaterial>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->super_ChVisualShape).material_list.
      super__Vector_base<std::shared_ptr<chrono::ChVisualMaterial>,_std::allocator<std::shared_ptr<chrono::ChVisualMaterial>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    peVar14 = (this_01->
              super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr;
    auVar3._60_4_ = 0;
    auVar3._0_60_ = (undefined1  [60])att._4_60_;
    att._0_64_ = auVar3 << 0x20;
    std::vector<int,_std::allocator<int>_>::resize
              (&peVar14->m_face_mat_indices,
               ((long)(peVar14->m_face_v_indices).
                      super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(peVar14->m_face_v_indices).
                     super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0xc,(value_type_conflict2 *)&att);
  }
LAB_00d67208:
  std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::~vector(&materials);
  std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::~vector(&shapes);
  std::__cxx11::string::~string((string *)&mtl_base);
  return;
}

Assistant:

void ChTriangleMeshShape::SetMesh(std::shared_ptr<geometry::ChTriangleMeshConnected> mesh, bool load_materials) {
    trimesh = mesh;

    // Try to read material information form an MTL file
    const auto& filename = mesh->GetFileName();
    auto mtl_base = filesystem::path(filesystem::path(filename).parent_path()).str();
    std::vector<tinyobj::shape_t> shapes;
    std::vector<tinyobj::material_t> materials;
    bool have_mtl_materials = false;

    if (load_materials && !filename.empty()) {
        tinyobj::attrib_t att;
        std::string warn;
        std::string err;

        bool success = tinyobj::LoadObj(&att, &shapes, &materials, &warn, &err, filename.c_str(), mtl_base.c_str());
        if (!success) {
            std::cerr << "Error loading OBJ file " << filename << std::endl;
            std::cerr << "   tiny_obj warning message: " << warn << std::endl;
            std::cerr << "   tiny_obj error message:   " << err << std::endl;
            std::cerr << "No materials loaded." << std::endl;
            return;
        }

        if (!materials.empty())
            have_mtl_materials = true;
    }

    if (have_mtl_materials) {
        // Discard any existing materials in material_list
        material_list.clear();

        // Copy materials into material_list
        for (int i = 0; i < materials.size(); i++) {
            std::shared_ptr<ChVisualMaterial> mat = chrono_types::make_shared<ChVisualMaterial>();
            mat->SetAmbientColor({materials[i].ambient[0], materials[i].ambient[1], materials[i].ambient[2]});
            mat->SetDiffuseColor({materials[i].diffuse[0], materials[i].diffuse[1], materials[i].diffuse[2]});
            mat->SetSpecularColor({materials[i].specular[0], materials[i].specular[1], materials[i].specular[2]});
            mat->SetEmissiveColor({materials[i].emission[0], materials[i].emission[1], materials[i].emission[2]});
            mat->SetMetallic(materials[i].metallic);
            mat->SetOpacity(materials[i].dissolve);
            mat->SetIllumination(materials[i].illum);
            mat->SetRoughness(materials[i].roughness);
            mat->SetSpecularExponent(materials[i].shininess);

            // If metallic and roughness is set to default, use specular workflow
            if (materials[i].metallic == 0 && materials[i].roughness == 0.5) {
                mat->SetUseSpecularWorkflow(true);
            } else {
                mat->SetUseSpecularWorkflow(false);
            }

            if (materials[i].diffuse_texname != "") {
                mat->SetKdTexture(mtl_base + "/" + materials[i].diffuse_texname);
            }

            if (materials[i].specular_texname != "") {
                mat->SetKsTexture(mtl_base + "/" +  materials[i].specular_texname);
                mat->SetUseSpecularWorkflow(true);
            }
            // set normal map when called "bump_texname"
            if (materials[i].bump_texname != "") {
                mat->SetNormalMapTexture(mtl_base + "/" + materials[i].bump_texname);
            }
            // set normal map when called "normal_texname"
            if (materials[i].normal_texname != "") {
                mat->SetNormalMapTexture(mtl_base + "/" + materials[i].normal_texname);
            }
            // set roughness texture if it exists
            if (materials[i].roughness_texname != "") {
                mat->SetRoughnessTexture(mtl_base + "/" + materials[i].roughness_texname);
                mat->SetUseSpecularWorkflow(false);
            }
            // set metallic texture if it exists
            if (materials[i].metallic_texname != "") {
                mat->SetMetallicTexture(mtl_base + "/" + materials[i].metallic_texname);
            }
            // set opacity texture if it exists
            // NOTE: need to make sure alpha and diffuse names are different to prevent 4 channel opacity textures in
            // Chrono::Sensor
            if (materials[i].alpha_texname != "" && materials[i].alpha_texname != materials[i].diffuse_texname) {
                mat->SetOpacityTexture(mtl_base + "/" + materials[i].alpha_texname);
            }

            material_list.push_back(mat);
        }

        // For each shape, copy material_indices. Faces that reference an invalid material are assigned the first one.
        trimesh->m_face_mat_indices.clear();
        for (int i = 0; i < shapes.size(); i++) {
            for (int j = 0; j < shapes[i].mesh.indices.size() / 3; j++) {
                if (shapes[i].mesh.material_ids[j] < 0 || shapes[i].mesh.material_ids[j] >= material_list.size()) {
                    trimesh->m_face_mat_indices.push_back(0);
                } else {
                    trimesh->m_face_mat_indices.push_back(shapes[i].mesh.material_ids[j]);
                }
            }
        }
    } else if (!material_list.empty()) {
        // Assign all faces to first material
        auto nfaces = trimesh->m_face_v_indices.size();
        trimesh->m_face_mat_indices.resize(nfaces, 0);
    }
}